

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifsetme(bifcxdef *ctx,int argc)

{
  objnum new_me;
  runsdef *prVar1;
  runcxdef *prVar2;
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  prVar2 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\x02') {
    prVar2->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f2);
  }
  new_me = (prVar2->runcxsp->runsv).runsvobj;
  if (new_me != 0xffff) {
    voc_set_me(prVar2->runcxvoc,new_me);
    return;
  }
  prVar2->runcxerr->errcxptr->erraav[0].errastr = "parserSetMe";
  ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
  runsign(ctx->bifcxrun,0x400);
}

Assistant:

void bifsetme(bifcxdef *ctx, int argc)
{
    objnum new_me;
    
    /* this function takes one argument */
    bifcntargs(ctx, 1, argc);

    /* get the new "Me" object */
    new_me = runpopobj(ctx->bifcxrun);

    /* "Me" cannot be nil */
    if (new_me == MCMONINV)
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "parserSetMe");

    /* set the current "Me" object in the parser */
    voc_set_me(ctx->bifcxrun->runcxvoc, new_me);
}